

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

QPDFNumberTreeObjectHelper *
QPDFNumberTreeObjectHelper::newEmpty
          (QPDFNumberTreeObjectHelper *__return_storage_ptr__,QPDF *qpdf,bool auto_repair)

{
  QPDFObjectHandle local_40;
  QPDFObjectHandle local_30;
  byte local_19;
  QPDF *pQStack_18;
  bool auto_repair_local;
  QPDF *qpdf_local;
  
  local_19 = auto_repair;
  pQStack_18 = qpdf;
  qpdf_local = (QPDF *)__return_storage_ptr__;
  operator____qpdf((char *)&local_40,0x430c94);
  QPDF::makeIndirectObject((QPDF *)&local_30,(QPDFObjectHandle *)qpdf);
  QPDFNumberTreeObjectHelper(__return_storage_ptr__,&local_30,pQStack_18,(bool)(local_19 & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  return __return_storage_ptr__;
}

Assistant:

QPDFNumberTreeObjectHelper
QPDFNumberTreeObjectHelper::newEmpty(QPDF& qpdf, bool auto_repair)
{
    return {qpdf.makeIndirectObject("<< /Nums [] >>"_qpdf), qpdf, auto_repair};
}